

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureStateQueryTests.cpp
# Opt level: O2

char * deqp::gles31::Functional::getVerifierSuffix(QueryType type)

{
  if (type - QUERY_TEXTURE_PARAM_INTEGER < 8) {
    return &DAT_018b56c4 + *(int *)(&DAT_018b56c4 + (ulong)(type - QUERY_TEXTURE_PARAM_INTEGER) * 4)
    ;
  }
  return (char *)0x0;
}

Assistant:

static const char* getVerifierSuffix (QueryType type)
{
	switch (type)
	{
		case QUERY_TEXTURE_PARAM_FLOAT:
		case QUERY_TEXTURE_PARAM_FLOAT_VEC4:					return "_float";

		case QUERY_TEXTURE_PARAM_INTEGER:
		case QUERY_TEXTURE_PARAM_INTEGER_VEC4:					return "_integer";

		case QUERY_TEXTURE_PARAM_PURE_INTEGER:
		case QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4:				return "_pure_int";

		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER:
		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4:	return "_pure_uint";

		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}